

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_emu_d3d56.cc
# Opt level: O0

bool __thiscall hwtest::pgraph::MthdEmuEmuD3D0Config::is_valid_val(MthdEmuEmuD3D0Config *this)

{
  MthdEmuEmuD3D0Config *this_local;
  
  if ((long)((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x36) < 0) {
    this_local._7_1_ = false;
  }
  else if (((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x32) >> 0x3e == 0) {
    this_local._7_1_ = false;
  }
  else if ((long)((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x31) < 0) {
    this_local._7_1_ = false;
  }
  else if ((((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x2c) >> 0x3c == 0) ||
          (8 < ((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x2c) >> 0x3c)) {
    this_local._7_1_ = false;
  }
  else if (((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x28) >> 0x3c < 5) {
    if (((ulong)(this->super_SingleMthdTest).super_MthdTest.val << 0x24) >> 0x3c < 5) {
      if (((this->super_SingleMthdTest).super_MthdTest.val & 0xf) < 3) {
        this_local._7_1_ = true;
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool is_valid_val() override {
		if (extr(val, 9, 1))
			return false;
		if (!extr(val, 12, 2))
			return false;
		if (extr(val, 14, 1))
			return false;
		if (extr(val, 16, 4) < 1 || extr(val, 16, 4) > 8)
			return false;
		if (extr(val, 20, 4) > 4)
			return false;
		if (extr(val, 24, 4) > 4)
			return false;
		if (extr(val, 0, 4) > 2)
			return false;
		return true;
	}